

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O0

int csp_hmac_set_key(void *key,uint32_t keylen)

{
  uint8_t hash [20];
  uint8_t *in_stack_00000030;
  uint32_t in_stack_0000003c;
  void *in_stack_00000040;
  undefined8 local_28;
  undefined8 local_20;
  
  csp_sha1_memory(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
  csp_hmac_key._0_8_ = local_28;
  csp_hmac_key._8_8_ = local_20;
  return 0;
}

Assistant:

int csp_hmac_set_key(const void * key, uint32_t keylen) {

	/* Use SHA1 as KDF */
	uint8_t hash[CSP_SHA1_DIGESTSIZE];
	csp_sha1_memory(key, keylen, hash);

	/* Copy key */
	memcpy(csp_hmac_key, hash, sizeof(csp_hmac_key));

	return CSP_ERR_NONE;
}